

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  uint key_00;
  int iVar2;
  cTValue *pcVar3;
  cTValue *in_RDX;
  GCtab *in_RSI;
  long in_RDI;
  Node *n;
  cTValue *tv_1;
  int32_t k;
  lua_Number nk;
  cTValue *tv;
  cTValue *local_50;
  cTValue *local_48;
  
  if ((in_RDX->field_2).it == 0xfffffffb) {
    pcVar3 = lj_tab_getstr(in_RSI,(GCstr *)(ulong)(in_RDX->u32).lo);
    if (pcVar3 != (cTValue *)0x0) {
      return pcVar3;
    }
  }
  else {
    if ((in_RDX->field_2).it < 0xfffeffff) {
      dVar1 = in_RDX->n;
      key_00 = (uint)dVar1;
      if ((dVar1 == (double)(int)key_00) && (!NAN(dVar1) && !NAN((double)(int)key_00))) {
        if (key_00 < in_RSI->asize) {
          local_50 = (cTValue *)((ulong)(in_RSI->array).ptr32 + (long)(int)key_00 * 8);
        }
        else {
          local_50 = lj_tab_getinth(in_RSI,key_00);
        }
        if (local_50 != (cTValue *)0x0) {
          return local_50;
        }
        goto LAB_00127aa1;
      }
    }
    else if ((in_RDX->field_2).it == 0xffffffff) goto LAB_00127aa1;
    local_48 = &hashkey(in_RSI,in_RDX)->val;
    do {
      iVar2 = lj_obj_equal(local_48 + 1,in_RDX);
      if (iVar2 != 0) {
        return local_48;
      }
      local_48 = (cTValue *)(ulong)local_48[2].u32.lo;
    } while (local_48 != (cTValue *)0x0);
  }
LAB_00127aa1:
  return (cTValue *)((ulong)*(uint *)(in_RDI + 8) + 0x130);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}